

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcDataStream::~CTcDataStream(CTcDataStream *this)

{
  CTcPrsMem *this_00;
  ulong uVar1;
  
  this->_vptr_CTcDataStream = (_func_int **)&PTR__CTcDataStream_00351508;
  if (this->page_cnt_ != 0) {
    uVar1 = 0;
    do {
      free(this->pages_[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->page_cnt_);
  }
  if (this->pages_ != (char **)0x0) {
    free(this->pages_);
  }
  this_00 = this->allocator_;
  if (this_00 != (CTcPrsMem *)0x0) {
    CTcPrsMem::~CTcPrsMem(this_00);
  }
  operator_delete(this_00,0x20);
  return;
}

Assistant:

CTcDataStream::~CTcDataStream()
{
    size_t i;

    /* delete the page slots if we allocated any */
    for (i = 0 ; i < page_cnt_ ; ++i)
        t3free(pages_[i]);

    /* delete the page slot array if we allocated it */
    if (pages_ != 0)
        t3free(pages_);

    /* delete our label/fixup allocator */
    delete allocator_;
}